

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O1

HighsStatus __thiscall
Highs::getRows(Highs *this,HighsInt num_set_entries,HighsInt *set,HighsInt *num_row,double *lower,
              double *upper,HighsInt *num_nz,HighsInt *start,HighsInt *index,double *value)

{
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  *this_00;
  HighsInt create_error;
  HighsStatus HVar1;
  string local_108;
  HighsLogOptions local_e8;
  HighsIndexCollection index_collection;
  
  if (num_set_entries == 0) {
    HVar1 = kOk;
    *num_row = 0;
    *num_nz = 0;
  }
  else {
    index_collection.dimension_ = -1;
    index_collection.is_interval_ = false;
    index_collection.from_ = -1;
    index_collection.to_ = -2;
    index_collection.is_set_ = false;
    index_collection.set_num_entries_ = -1;
    index_collection.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    index_collection.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    index_collection.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    index_collection.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    index_collection.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    index_collection.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish._1_7_ = 0;
    index_collection.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    index_collection._41_8_ = 0;
    create_error = create(&index_collection,num_set_entries,set,(this->model_).lp_.num_row_);
    if (create_error == 0) {
      HVar1 = kOk;
      getRowsInterface(this,&index_collection,num_row,lower,upper,num_nz,start,index,value);
    }
    else {
      local_e8.log_stream = (this->options_).super_HighsOptionsStruct.log_options.log_stream;
      local_e8.output_flag = (this->options_).super_HighsOptionsStruct.log_options.output_flag;
      local_e8.log_to_console = (this->options_).super_HighsOptionsStruct.log_options.log_to_console
      ;
      local_e8.log_dev_level = (this->options_).super_HighsOptionsStruct.log_options.log_dev_level;
      local_e8.user_log_callback =
           (this->options_).super_HighsOptionsStruct.log_options.user_log_callback;
      local_e8.user_log_callback_data =
           (this->options_).super_HighsOptionsStruct.log_options.user_log_callback_data;
      this_00 = &local_e8.user_callback;
      std::
      function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
      ::function(this_00,&(this->options_).super_HighsOptionsStruct.log_options.user_callback);
      local_e8.user_callback_active =
           (this->options_).super_HighsOptionsStruct.log_options.user_callback_active;
      local_e8.user_callback_data =
           (this->options_).super_HighsOptionsStruct.log_options.user_callback_data;
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"getRows","");
      analyseSetCreateError
                (&local_e8,&local_108,create_error,false,num_set_entries,set,
                 (this->model_).lp_.num_row_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p);
      }
      HVar1 = kError;
      if (local_e8.user_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_e8.user_callback.super__Function_base._M_manager)
                  ((_Any_data *)this_00,(_Any_data *)this_00,__destroy_functor);
      }
    }
    if (index_collection.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(index_collection.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (index_collection.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(index_collection.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return HVar1;
}

Assistant:

HighsStatus Highs::getRows(const HighsInt num_set_entries, const HighsInt* set,
                           HighsInt& num_row, double* lower, double* upper,
                           HighsInt& num_nz, HighsInt* start, HighsInt* index,
                           double* value) const {
  if (num_set_entries == 0) {
    num_row = 0;
    num_nz = 0;
    return HighsStatus::kOk;
  }
  HighsIndexCollection index_collection;
  const HighsInt create_error =
      create(index_collection, num_set_entries, set, model_.lp_.num_row_);
  if (create_error)
    return analyseSetCreateError(options_.log_options, "getRows", create_error,
                                 false, num_set_entries, set,
                                 model_.lp_.num_row_);
  getRowsInterface(index_collection, num_row, lower, upper, num_nz, start,
                   index, value);
  return HighsStatus::kOk;
}